

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

uint ImGui::RoundScalarWithFormatT<unsigned_int,int>(char *format,ImGuiDataType data_type,uint v)

{
  undefined1 auVar1 [16];
  char *src;
  uint in_EDX;
  int in_ESI;
  char *in_RDI;
  double dVar2;
  undefined8 extraout_XMM0_Qb;
  char *p;
  char v_str [64];
  char fmt_sanitized [32];
  char *fmt_start;
  size_t in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char local_48 [40];
  char *local_20;
  uint local_18;
  int local_14;
  uint local_4;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_20 = ImParseFormatFindStart(in_RDI);
  if ((*local_20 == '%') && (local_20[1] != '%')) {
    SanitizeFormatString
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    local_20 = local_48;
    ImFormatString(&stack0xffffffffffffff78,0x40,local_20,(ulong)local_18);
    for (src = &stack0xffffffffffffff78; *src == ' '; src = src + 1) {
    }
    if ((local_14 == 8) || (local_14 == 9)) {
      dVar2 = atof(src);
      auVar1._8_8_ = extraout_XMM0_Qb;
      auVar1._0_8_ = dVar2;
      local_18 = vcvttsd2usi_avx512f(auVar1);
    }
    else {
      ImAtoi<int>(src,(int *)&local_18);
    }
    local_4 = local_18;
  }
  else {
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}